

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeUpper(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,int i,
             number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *newUpper,bool scale)

{
  uint *puVar1;
  pointer pnVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int32_t iVar10;
  int iVar11;
  undefined7 in_register_00000009;
  long in_FS_OFFSET;
  cpp_dec_float<100U,_int,_void> local_b8;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  uint local_38;
  uint uStack_34;
  uint uStack_30;
  uint uStack_2c;
  int local_28;
  undefined1 local_24;
  undefined8 local_20;
  
  if ((int)CONCAT71(in_register_00000009,scale) != 0) {
    ::soplex::infinity::__tls_init();
    local_b8.fpclass = cpp_dec_float_finite;
    local_b8.prec_elem = 0x10;
    local_b8.data._M_elems[0] = 0;
    local_b8.data._M_elems[1] = 0;
    local_b8.data._M_elems[2] = 0;
    local_b8.data._M_elems[3] = 0;
    local_b8.data._M_elems[4] = 0;
    local_b8.data._M_elems[5] = 0;
    local_b8.data._M_elems[6] = 0;
    local_b8.data._M_elems[7] = 0;
    local_b8.data._M_elems[8] = 0;
    local_b8.data._M_elems[9] = 0;
    local_b8.data._M_elems[10] = 0;
    local_b8.data._M_elems[0xb] = 0;
    local_b8.data._M_elems[0xc] = 0;
    local_b8.data._M_elems[0xd] = 0;
    local_b8.data._M_elems._56_5_ = 0;
    local_b8.data._M_elems[0xf]._1_3_ = 0;
    local_b8.exp = 0;
    local_b8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_b8,*(double *)(in_FS_OFFSET + -8));
    if ((((newUpper->m_backend).fpclass != cpp_dec_float_NaN) &&
        (local_b8.fpclass != cpp_dec_float_NaN)) &&
       (iVar11 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&newUpper->m_backend,&local_b8), iVar11 < 0)) {
      local_68 = (newUpper->m_backend).data._M_elems[0];
      uStack_64 = (newUpper->m_backend).data._M_elems[1];
      uStack_60 = (newUpper->m_backend).data._M_elems[2];
      uStack_5c = (newUpper->m_backend).data._M_elems[3];
      local_58 = (newUpper->m_backend).data._M_elems[4];
      uStack_54 = (newUpper->m_backend).data._M_elems[5];
      uStack_50 = (newUpper->m_backend).data._M_elems[6];
      uStack_4c = (newUpper->m_backend).data._M_elems[7];
      local_48 = (newUpper->m_backend).data._M_elems[8];
      uStack_44 = (newUpper->m_backend).data._M_elems[9];
      uStack_40 = (newUpper->m_backend).data._M_elems[10];
      uStack_3c = (newUpper->m_backend).data._M_elems[0xb];
      local_38 = (newUpper->m_backend).data._M_elems[0xc];
      uStack_34 = (newUpper->m_backend).data._M_elems[0xd];
      uStack_30 = (newUpper->m_backend).data._M_elems[0xe];
      uStack_2c = (newUpper->m_backend).data._M_elems[0xf];
      local_28 = (newUpper->m_backend).exp;
      local_24 = (newUpper->m_backend).neg;
      local_20._0_4_ = (newUpper->m_backend).fpclass;
      local_20._4_4_ = (newUpper->m_backend).prec_elem;
      (*this->lp_scaler->_vptr_SPxScaler[0x2c])(&local_b8,this->lp_scaler,this,i);
      newUpper = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_b8;
    }
  }
  pnVar2 = (this->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).up.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = *(undefined8 *)(newUpper->m_backend).data._M_elems;
  uVar4 = *(undefined8 *)((newUpper->m_backend).data._M_elems + 2);
  uVar5 = *(undefined8 *)((newUpper->m_backend).data._M_elems + 4);
  uVar6 = *(undefined8 *)((newUpper->m_backend).data._M_elems + 6);
  uVar7 = *(undefined8 *)((newUpper->m_backend).data._M_elems + 8);
  uVar8 = *(undefined8 *)((newUpper->m_backend).data._M_elems + 10);
  uVar9 = *(undefined8 *)((newUpper->m_backend).data._M_elems + 0xe);
  puVar1 = pnVar2[i].m_backend.data._M_elems + 0xc;
  *(undefined8 *)puVar1 = *(undefined8 *)((newUpper->m_backend).data._M_elems + 0xc);
  *(undefined8 *)(puVar1 + 2) = uVar9;
  puVar1 = pnVar2[i].m_backend.data._M_elems + 8;
  *(undefined8 *)puVar1 = uVar7;
  *(undefined8 *)(puVar1 + 2) = uVar8;
  puVar1 = pnVar2[i].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = uVar5;
  *(undefined8 *)(puVar1 + 2) = uVar6;
  *(undefined8 *)&pnVar2[i].m_backend.data = uVar3;
  *(undefined8 *)(pnVar2[i].m_backend.data._M_elems + 2) = uVar4;
  pnVar2[i].m_backend.exp = (newUpper->m_backend).exp;
  pnVar2[i].m_backend.neg = (newUpper->m_backend).neg;
  iVar10 = (newUpper->m_backend).prec_elem;
  pnVar2[i].m_backend.fpclass = (newUpper->m_backend).fpclass;
  pnVar2[i].m_backend.prec_elem = iVar10;
  return;
}

Assistant:

virtual void changeUpper(int i, const R& newUpper, bool scale = false)
   {
      if(scale && newUpper < R(infinity))
      {
         assert(_isScaled);
         assert(lp_scaler);
         LPColSetBase<R>::upper_w(i) = lp_scaler->scaleUpper(*this, i, newUpper);
      }
      else
         LPColSetBase<R>::upper_w(i) = newUpper;

      assert(isConsistent());
   }